

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeSet::_toPattern(UnicodeSet *this,UnicodeString *result,UBool escapeUnprintable)

{
  char16_t cVar1;
  ushort uVar2;
  UBool UVar3;
  uint uVar4;
  UnicodeString *pUVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint c;
  
  if (this->pat != (char16_t *)0x0) {
    iVar7 = this->patLen;
    if (0 < iVar7) {
      uVar8 = 0;
      iVar9 = 0;
      do {
        iVar6 = iVar9 + 1;
        cVar1 = this->pat[iVar9];
        c = (uint)(ushort)cVar1;
        if ((((c & 0xfc00) == 0xd800) && (iVar6 != iVar7)) &&
           (uVar4 = (uint)(ushort)this->pat[iVar6], (uVar4 & 0xfc00) == 0xdc00)) {
          c = (uint)(ushort)cVar1 * 0x400 + uVar4 + 0xfca02400;
          iVar6 = iVar9 + 2;
        }
        iVar9 = iVar6;
        if ((escapeUnprintable == '\0') || (UVar3 = ICU_Utility::isUnprintable(c), UVar3 == '\0')) {
          UnicodeString::append(result,c);
          uVar8 = uVar8 + 1;
          if (c != 0x5c) {
            uVar8 = 0;
          }
        }
        else {
          if ((uVar8 & 0x80000001) == 1) {
            uVar2 = (result->fUnion).fStackFields.fLengthAndFlags;
            if ((short)uVar2 < 0) {
              iVar7 = (result->fUnion).fFields.fLength;
            }
            else {
              iVar7 = (int)(short)uVar2 >> 5;
            }
            iVar6 = iVar7 + -1;
            if (iVar6 == 0 && ((int)(short)uVar2 & 1U) != 0) {
              UnicodeString::unBogus(result);
            }
            else if (iVar7 != 0) {
              if (iVar7 < 0x401) {
                (result->fUnion).fStackFields.fLengthAndFlags = (short)iVar6 * 0x20 | uVar2 & 0x1f;
              }
              else {
                (result->fUnion).fStackFields.fLengthAndFlags = uVar2 | 0xffe0;
                (result->fUnion).fFields.fLength = iVar6;
              }
            }
          }
          ICU_Utility::escapeUnprintable(result,c);
          uVar8 = 0;
        }
        iVar7 = this->patLen;
      } while (iVar9 < iVar7);
    }
    return result;
  }
  pUVar5 = _generatePattern(this,result,escapeUnprintable);
  return pUVar5;
}

Assistant:

UnicodeString& UnicodeSet::_toPattern(UnicodeString& result,
                                      UBool escapeUnprintable) const
{
    if (pat != NULL) {
        int32_t i;
        int32_t backslashCount = 0;
        for (i=0; i<patLen; ) {
            UChar32 c;
            U16_NEXT(pat, i, patLen, c);
            if (escapeUnprintable && ICU_Utility::isUnprintable(c)) {
                // If the unprintable character is preceded by an odd
                // number of backslashes, then it has been escaped.
                // Before unescaping it, we delete the final
                // backslash.
                if ((backslashCount % 2) == 1) {
                    result.truncate(result.length() - 1);
                }
                ICU_Utility::escapeUnprintable(result, c);
                backslashCount = 0;
            } else {
                result.append(c);
                if (c == BACKSLASH) {
                    ++backslashCount;
                } else {
                    backslashCount = 0;
                }
            }
        }
        return result;
    }

    return _generatePattern(result, escapeUnprintable);
}